

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::end_examples(search *sch)

{
  long *plVar1;
  undefined8 uVar2;
  typed_option<unsigned_int> *key;
  long *in_RDI;
  uint32_t val;
  vw *all;
  search_private *priv;
  undefined8 in_stack_fffffffffffffea8;
  typed_option<unsigned_int> *in_stack_fffffffffffffeb0;
  typed_option<unsigned_int> *this;
  string *in_stack_fffffffffffffec8;
  options_i *this_00;
  int local_110;
  undefined1 local_109 [33];
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  long local_18;
  long *local_10;
  
  local_10 = (long *)*in_RDI;
  local_18 = *local_10;
  if ((*(byte *)(local_18 + 0x343a) & 1) != 0) {
    if (local_10[0x5a] == 0) {
      local_110 = (int)local_10[0x56];
    }
    else {
      local_110 = (int)local_10[0x56] + 1;
    }
    local_1c = local_110;
    plVar1 = *(long **)(local_18 + 0x278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"search_trained_nb_policies",&local_41);
    std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    (**(code **)(*plVar1 + 0x30))(plVar1,local_40,local_78);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_00 = *(options_i **)(local_18 + 0x278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"search_trained_nb_policies",&local_99);
    key = VW::config::options_i::get_typed_option<unsigned_int>(this_00,in_stack_fffffffffffffec8);
    VW::config::typed_option<unsigned_int>::value
              (in_stack_fffffffffffffeb0,(uint)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    plVar1 = *(long **)(local_18 + 0x278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"search_total_nb_policies",&local_c1);
    std::__cxx11::to_string((uint)((ulong)key >> 0x20));
    (**(code **)(*plVar1 + 0x30))(plVar1,local_c0,local_e8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    uVar2 = *(undefined8 *)(local_18 + 0x278);
    this = (typed_option<unsigned_int> *)local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_109 + 1),"search_total_nb_policies",(allocator *)this);
    VW::config::options_i::get_typed_option<unsigned_int>(this_00,(string *)key);
    VW::config::typed_option<unsigned_int>::value(this,(uint)((ulong)uVar2 >> 0x20));
    std::__cxx11::string::~string((string *)(local_109 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_109);
  }
  return;
}

Assistant:

void end_examples(search& sch)
{
  search_private& priv = *sch.priv;
  vw* all = priv.all;

  if (all->training)
  {
    // TODO work out a better system to update state that will be saved in the model.
    // Dig out option and change it in case we already loaded a predictor which had a value stored for
    // --search_trained_nb_policies
    auto val = (priv.passes_since_new_policy == 0) ? priv.current_policy : (priv.current_policy + 1);
    all->options->replace("search_trained_nb_policies", std::to_string(val));
    all->options->get_typed_option<uint32_t>("search_trained_nb_policies").value(val);
    // Dig out option and change it in case we already loaded a predictor which had a value stored for
    // --search_total_nb_policies
    all->options->replace("search_total_nb_policies", std::to_string(priv.total_number_of_policies));
    all->options->get_typed_option<uint32_t>("search_total_nb_policies").value(priv.total_number_of_policies);
  }
}